

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall QSynth::setNiceAmpRampEnabled(QSynth *this,bool enabled)

{
  bool bVar1;
  undefined1 local_28 [8];
  QMutexLocker<QMutex> synthLocker;
  bool enabled_local;
  QSynth *this_local;
  
  synthLocker._15_1_ = enabled;
  bVar1 = isRealtime(this);
  if (bVar1) {
    RealtimeHelper::setNiceAmpRampEnabled(this->realtimeHelper,(bool)(synthLocker._15_1_ & 1));
  }
  else {
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,this->synthMutex);
    bVar1 = isOpen(this);
    if (bVar1) {
      MT32Emu::Synth::setNiceAmpRampEnabled(this->synth,(bool)(synthLocker._15_1_ & 1));
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  return;
}

Assistant:

void QSynth::setNiceAmpRampEnabled(bool enabled) {
	if (isRealtime()) {
		realtimeHelper->setNiceAmpRampEnabled(enabled);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) synth->setNiceAmpRampEnabled(enabled);
	}
}